

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O0

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addReturnNodesOperands
          (LLVMPointerGraphBuilder *this,Function *F,PointerSubgraph *subg,PSNode *callNode)

{
  bool bVar1;
  reference ppPVar2;
  long in_RCX;
  long in_RDX;
  PSNode *in_RSI;
  PSNode *in_RDI;
  LLVMPointerGraphBuilder *unaff_retaddr;
  PSNode *r;
  iterator __end2;
  iterator __begin2;
  set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_> *__range2
  ;
  PSNode *callNode_00;
  _Self local_38;
  _Self local_30;
  long local_28;
  long local_20;
  PSNode *F_00;
  
  local_28 = in_RDX + 0x60;
  local_20 = in_RCX;
  F_00 = in_RDI;
  local_30._M_node =
       (_Base_ptr)
       std::set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
       ::begin((set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
                *)in_RDI);
  local_38._M_node =
       (_Base_ptr)
       std::set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
       ::end((set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
              *)in_RDI);
  while( true ) {
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    ppPVar2 = std::_Rb_tree_const_iterator<dg::pta::PSNode_*>::operator*
                        ((_Rb_tree_const_iterator<dg::pta::PSNode_*> *)0x1b1f9c);
    callNode_00 = *ppPVar2;
    if (local_20 == 0) {
      addReturnNodeOperand(unaff_retaddr,(Function *)F_00,in_RSI);
    }
    else {
      addReturnNodeOperand(callNode_00,in_RDI);
    }
    std::_Rb_tree_const_iterator<dg::pta::PSNode_*>::operator++
              ((_Rb_tree_const_iterator<dg::pta::PSNode_*> *)callNode_00);
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addReturnNodesOperands(const llvm::Function *F,
                                                     PointerSubgraph &subg,
                                                     PSNode *callNode) {
    using namespace llvm;

    for (PSNode *r : subg.returnNodes) {
        // call-return node is like a PHI node
        // But we're interested only in the nodes that return some value
        // from subprocedure, not for all nodes that have no successor.
        if (callNode) {
            addReturnNodeOperand(callNode, r);
        } else {
            addReturnNodeOperand(F, r);
        }
    }
}